

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall gl4cts::GPUShaderFP64Test4::initUniformValues(GPUShaderFP64Test4 *this)

{
  GLuint GVar1;
  GLuint GVar2;
  _stage_data *p_Var3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar7;
  _stage_data **pp_Var8;
  uint n_stage;
  long lVar9;
  undefined8 local_68;
  _stage_data *cs_stages [1];
  _stage_data *noncs_stages [5];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  cs_stages[0] = &this->m_data_cs;
  noncs_stages[0] = &this->m_data_fs;
  noncs_stages[1] = &this->m_data_gs;
  noncs_stages[2] = &this->m_data_tc;
  noncs_stages[3] = &this->m_data_te;
  noncs_stages[4] = &this->m_data_vs;
  local_68._0_4_ = this->m_po_cs_id;
  local_68._4_4_ = this->m_po_noncs_id;
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    GVar1 = *(GLuint *)((long)cs_stages + lVar7 * 4 + -8);
    GVar2 = this->m_po_cs_id;
    pp_Var8 = noncs_stages;
    if (GVar1 == GVar2) {
      pp_Var8 = cs_stages;
    }
    if (GVar1 != 0) {
      (**(code **)(lVar6 + 0x1680))();
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"UseProgram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x1a06);
      for (lVar9 = 0; (ulong)(GVar1 != GVar2) * 4 + 1 != lVar9; lVar9 = lVar9 + 1) {
        p_Var3 = pp_Var8[lVar9];
        (**(code **)(lVar6 + 0x14d0))
                  ((p_Var3->uniforms).uniform_double,(p_Var3->uniforms).uniform_location_double);
        (**(code **)(lVar6 + 0x14d0))
                  ((p_Var3->uniforms).uniform_double_arr[0],
                   (p_Var3->uniforms).uniform_location_double_arr[0]);
        (**(code **)(lVar6 + 0x14d0))
                  ((p_Var3->uniforms).uniform_double_arr[1],
                   (p_Var3->uniforms).uniform_location_double_arr[1]);
        (**(code **)(lVar6 + 0x14d0))
                  (p_Var3->uniform_structure_arrays[0].uniform_double,
                   p_Var3->uniform_structure_arrays[0].uniform_location_double);
        (**(code **)(lVar6 + 0x14d0))
                  (p_Var3->uniform_structure_arrays[1].uniform_double,
                   p_Var3->uniform_structure_arrays[1].uniform_location_double);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"gluniform1d() call(s) failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x1a14);
        (**(code **)(lVar6 + 0x1518))
                  ((p_Var3->uniforms).uniform_location_dvec2,1,(p_Var3->uniforms).uniform_dvec2);
        (**(code **)(lVar6 + 0x1518))
                  ((p_Var3->uniforms).uniform_location_dvec2_arr[0],1,
                   (p_Var3->uniforms).uniform_dvec2_arr);
        (**(code **)(lVar6 + 0x1518))
                  ((p_Var3->uniforms).uniform_location_dvec2_arr[1],1,
                   (p_Var3->uniforms).uniform_dvec2_arr + 2);
        (**(code **)(lVar6 + 0x1518))
                  (p_Var3->uniform_structure_arrays[0].uniform_location_dvec2,1,
                   p_Var3->uniform_structure_arrays[0].uniform_dvec2);
        (**(code **)(lVar6 + 0x1518))
                  (p_Var3->uniform_structure_arrays[1].uniform_location_dvec2,1,
                   p_Var3->uniform_structure_arrays[1].uniform_dvec2);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"gluniform2dv() call(s) failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x1a1f);
        (**(code **)(lVar6 + 0x1558))
                  ((p_Var3->uniforms).uniform_location_dvec3,1,(p_Var3->uniforms).uniform_dvec3);
        (**(code **)(lVar6 + 0x1558))
                  ((p_Var3->uniforms).uniform_location_dvec3_arr[0],1,
                   (p_Var3->uniforms).uniform_dvec3_arr);
        (**(code **)(lVar6 + 0x1558))
                  ((p_Var3->uniforms).uniform_location_dvec3_arr[1],1,
                   (p_Var3->uniforms).uniform_dvec3_arr + 3);
        (**(code **)(lVar6 + 0x1558))
                  (p_Var3->uniform_structure_arrays[0].uniform_location_dvec3,1,
                   p_Var3->uniform_structure_arrays[0].uniform_dvec3);
        (**(code **)(lVar6 + 0x1558))
                  (p_Var3->uniform_structure_arrays[1].uniform_location_dvec3,1,
                   p_Var3->uniform_structure_arrays[1].uniform_dvec3);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"gluniform3dv() call(s) failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x1a2a);
        (**(code **)(lVar6 + 0x1598))
                  ((p_Var3->uniforms).uniform_location_dvec4,1,(p_Var3->uniforms).uniform_dvec4);
        (**(code **)(lVar6 + 0x1598))
                  ((p_Var3->uniforms).uniform_location_dvec4_arr[0],1,
                   (p_Var3->uniforms).uniform_dvec4_arr);
        (**(code **)(lVar6 + 0x1598))
                  ((p_Var3->uniforms).uniform_location_dvec4_arr[1],1,
                   (p_Var3->uniforms).uniform_dvec4_arr + 4);
        (**(code **)(lVar6 + 0x1598))
                  (p_Var3->uniform_structure_arrays[0].uniform_location_dvec4,1,
                   p_Var3->uniform_structure_arrays[0].uniform_dvec4);
        (**(code **)(lVar6 + 0x1598))
                  (p_Var3->uniform_structure_arrays[1].uniform_location_dvec4,1,
                   p_Var3->uniform_structure_arrays[1].uniform_dvec4);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"gluniform4dv() call(s) failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x1a35);
      }
    }
  }
  return;
}

Assistant:

void GPUShaderFP64Test4::initUniformValues()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Iterate through all programs */
	_stage_data*	   cs_stages[]	= { &m_data_cs };
	_stage_data*	   noncs_stages[] = { &m_data_fs, &m_data_gs, &m_data_tc, &m_data_te, &m_data_vs };
	const unsigned int n_cs_stages	= sizeof(cs_stages) / sizeof(cs_stages[0]);
	const unsigned int n_noncs_stages = sizeof(noncs_stages) / sizeof(noncs_stages[0]);

	const glw::GLuint  programs[] = { m_po_cs_id, m_po_noncs_id };
	const unsigned int n_programs = sizeof(programs) / sizeof(programs[0]);

	for (unsigned int n_program = 0; n_program < n_programs; ++n_program)
	{
		glw::GLuint   po_id		 = programs[n_program];
		unsigned int  n_stages   = 0;
		_stage_data** stage_data = DE_NULL;

		if (po_id == m_po_cs_id)
		{
			n_stages   = n_cs_stages;
			stage_data = cs_stages;
		}
		else
		{
			n_stages   = n_noncs_stages;
			stage_data = noncs_stages;
		}

		/* Skip compute shader program if not supported */
		if (0 == po_id)
		{
			continue;
		}

		gl.useProgram(po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

		for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
		{
			/* Iterate through all uniforms */
			_stage_data* stage_ptr = stage_data[n_stage];

			gl.uniform1d(stage_ptr->uniforms.uniform_location_double, stage_ptr->uniforms.uniform_double);
			gl.uniform1d(stage_ptr->uniforms.uniform_location_double_arr[0], stage_ptr->uniforms.uniform_double_arr[0]);
			gl.uniform1d(stage_ptr->uniforms.uniform_location_double_arr[1], stage_ptr->uniforms.uniform_double_arr[1]);
			gl.uniform1d(stage_ptr->uniform_structure_arrays[0].uniform_location_double,
						 stage_ptr->uniform_structure_arrays[0].uniform_double);
			gl.uniform1d(stage_ptr->uniform_structure_arrays[1].uniform_location_double,
						 stage_ptr->uniform_structure_arrays[1].uniform_double);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gluniform1d() call(s) failed.");

			gl.uniform2dv(stage_ptr->uniforms.uniform_location_dvec2, 1 /* count */, stage_ptr->uniforms.uniform_dvec2);
			gl.uniform2dv(stage_ptr->uniforms.uniform_location_dvec2_arr[0], 1 /* count */,
						  stage_ptr->uniforms.uniform_dvec2_arr + 0);
			gl.uniform2dv(stage_ptr->uniforms.uniform_location_dvec2_arr[1], 1 /* count */,
						  stage_ptr->uniforms.uniform_dvec2_arr + 2);
			gl.uniform2dv(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec2, 1 /* count */,
						  stage_ptr->uniform_structure_arrays[0].uniform_dvec2);
			gl.uniform2dv(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec2, 1 /* count */,
						  stage_ptr->uniform_structure_arrays[1].uniform_dvec2);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gluniform2dv() call(s) failed.");

			gl.uniform3dv(stage_ptr->uniforms.uniform_location_dvec3, 1 /* count */, stage_ptr->uniforms.uniform_dvec3);
			gl.uniform3dv(stage_ptr->uniforms.uniform_location_dvec3_arr[0], 1 /* count */,
						  stage_ptr->uniforms.uniform_dvec3_arr + 0);
			gl.uniform3dv(stage_ptr->uniforms.uniform_location_dvec3_arr[1], 1 /* count */,
						  stage_ptr->uniforms.uniform_dvec3_arr + 3);
			gl.uniform3dv(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec3, 1 /* count */,
						  stage_ptr->uniform_structure_arrays[0].uniform_dvec3);
			gl.uniform3dv(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec3, 1 /* count */,
						  stage_ptr->uniform_structure_arrays[1].uniform_dvec3);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gluniform3dv() call(s) failed.");

			gl.uniform4dv(stage_ptr->uniforms.uniform_location_dvec4, 1 /* count */, stage_ptr->uniforms.uniform_dvec4);
			gl.uniform4dv(stage_ptr->uniforms.uniform_location_dvec4_arr[0], 1 /* count */,
						  stage_ptr->uniforms.uniform_dvec4_arr + 0);
			gl.uniform4dv(stage_ptr->uniforms.uniform_location_dvec4_arr[1], 1 /* count */,
						  stage_ptr->uniforms.uniform_dvec4_arr + 4);
			gl.uniform4dv(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec4, 1 /* count */,
						  stage_ptr->uniform_structure_arrays[0].uniform_dvec4);
			gl.uniform4dv(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec4, 1 /* count */,
						  stage_ptr->uniform_structure_arrays[1].uniform_dvec4);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gluniform4dv() call(s) failed.");
		} /* for (all shader stages) */
	}	 /* for (both program objects) */
}